

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.H
# Opt level: O3

void __thiscall String::String(String *this,char *s,bool nc)

{
  size_t sVar1;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  (this->super_string)._M_dataplus._M_p = (pointer)&(this->super_string).field_2;
  (this->super_string)._M_string_length = 0;
  (this->super_string).field_2._M_local_buf[0] = '\0';
  this->_noCase = nc;
  this->_no = false;
  this->_list = false;
  local_40 = local_30;
  if (s == (char *)0x0) {
    local_38 = 0;
    local_30[0] = '\0';
  }
  else {
    sVar1 = strlen(s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,s,s + sVar1);
    if (local_38 != 0) {
      if (*local_40 == '!') {
        std::__cxx11::string::assign((string *)this,(ulong)&local_40,1);
        this->_no = true;
        goto LAB_00106e0d;
      }
      if (*local_40 == '@') {
        std::__cxx11::string::_M_assign((string *)this);
        this->_list = true;
        goto LAB_00106e0d;
      }
    }
  }
  std::__cxx11::string::_M_assign((string *)this);
LAB_00106e0d:
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

inline String(char const * s, bool nc = false)
        : _noCase(nc)
        , _no(false)
        , _list(false)
    {
        setValue(s != nullptr ? std::string(s) : std::string());
    }